

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

bool __thiscall capnp::_::PointerReader::isCanonical(PointerReader *this,word **readHead)

{
  undefined1 uVar1;
  PointerType PVar2;
  bool bVar3;
  bool ptrTrunc;
  bool dataTrunc;
  StructReader structReader;
  
  bVar3 = true;
  if (this->pointer != (WirePointer *)0x0) {
    if (((this->pointer->offsetAndKind).value & 2) == 0) {
      PVar2 = getPointerType(this);
      uVar1 = (*(code *)(&DAT_004b09c4 + *(int *)(&DAT_004b09c4 + (ulong)PVar2 * 4)))();
      return (bool)uVar1;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool PointerReader::isCanonical(const word **readHead) {
  if (!this->pointer) {
    // The pointer is null, so we are canonical and do not read
    return true;
  }

  if (!this->pointer->isPositional()) {
    // The pointer is a FAR or OTHER pointer, and is non-canonical
    return false;
  }

  switch (this->getPointerType()) {
    case PointerType::NULL_:
      // The pointer is null, we are canonical and do not read
      return true;
    case PointerType::STRUCT: {
      bool dataTrunc = false, ptrTrunc = false;
      auto structReader = this->getStruct(nullptr);
      if (structReader.getDataSectionSize() == ZERO * BITS &&
          structReader.getPointerSectionSize() == ZERO * POINTERS) {
        return reinterpret_cast<const word*>(this->pointer) == structReader.getLocation();
      } else {
        // Fun fact: Once this call to isCanonical() returns, Clang may re-order the evaluation of
        //   the && operators. In theory this is wrong because && is short-circuiting, but Clang
        //   apparently sees that there are no side effects to the right of &&, so decides it is
        //   safe to skip short-circuiting. It turns out, though, this is observable under
        //   valgrind: if we don't initialize `dataTrunc` when declaring it above, then valgrind
        //   reports "Conditional jump or move depends on uninitialised value(s)". Specifically
        //   this happens in cases where structReader.isCanonical() returns false -- it is allowed
        //   to skip initializing `dataTrunc` in that case. The short-circuiting && should mean
        //   that we don't read `dataTrunc` in that case, except Clang's optimizations. Ultimately
        //   the uninitialized read is fine because eventually the whole expression evaluates false
        //   either way. But, to make valgrind happy, we initialize the bools above...
        return structReader.isCanonical(readHead, readHead, &dataTrunc, &ptrTrunc) && dataTrunc && ptrTrunc;
      }
    }
    case PointerType::LIST:
      return this->getListAnySize(nullptr).isCanonical(readHead, pointer);
    case PointerType::CAPABILITY:
      KJ_FAIL_ASSERT("Capabilities are not positional");
  }
  KJ_UNREACHABLE;
}